

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processQueryResponse(CommonCore *this,ActionMessage *message)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type sVar3;
  reference pvVar4;
  __tuple_element_t<2UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *p_Var5;
  long in_RSI;
  long in_RDI;
  SmallBuffer *this_01;
  int in_stack_0000000c;
  string *in_stack_00000010;
  JsonMapBuilder *in_stack_00000018;
  int ii;
  string str;
  __tuple_element_t<1UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *requesters;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *builder;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *in_stack_fffffffffffffec8;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar6;
  allocator<char> *in_stack_ffffffffffffff00;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  CommonCore *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  GlobalBrokerId id;
  int local_c4;
  undefined1 local_99 [49];
  __tuple_element_t<1UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *local_68;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *local_60;
  allocator<char> local_41;
  string_view local_40;
  ActionMessage *in_stack_ffffffffffffffd8;
  CommonCore *in_stack_ffffffffffffffe0;
  
  if (*(short *)(in_RSI + 0x18) == 0) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x998);
    local_40 = SmallBuffer::to_string((SmallBuffer *)0x486831);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (this_00,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar2,val);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffed0);
    std::allocator<char>::~allocator(&local_41);
    return;
  }
  bVar1 = isValidIndex<unsigned_short,std::vector<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>,std::allocator<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>>>>
                    ((unsigned_short)((ulong)in_stack_fffffffffffffed0 >> 0x30),
                     in_stack_fffffffffffffec8);
  if (!bVar1) {
    return;
  }
  this_01 = (SmallBuffer *)(in_RDI + 0xad0);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                *)this_01,(ulong)*(ushort *)(in_RSI + 0x18));
  local_60 = std::
             get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                       ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         *)0x486944);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                *)this_01,(ulong)*(ushort *)(in_RSI + 0x18));
  local_68 = std::
             get<1ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                       ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         *)0x48696c);
  __a = local_60;
  local_99._1_16_ = (undefined1  [16])SmallBuffer::to_string((SmallBuffer *)0x486992);
  __t = (basic_string_view<char,_std::char_traits<char>_> *)local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff10,__t,(allocator<char> *)__a);
  bVar1 = fileops::JsonMapBuilder::addComponent
                    (in_stack_00000018,in_stack_00000010,in_stack_0000000c);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef4);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed0);
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  if ((uVar6 & 0x1000000) == 0) {
    return;
  }
  fileops::JsonMapBuilder::generate_abi_cxx11_((JsonMapBuilder *)this_01);
  if (*(short *)(in_RSI + 0x18) == 8) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  }
  local_c4 = 0;
  while (iVar2 = local_c4,
        sVar3 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::size
                          (local_68), iVar2 < (int)sVar3 + -1) {
    pvVar4 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                       (local_68,(long)local_c4);
    bVar1 = GlobalFederateId::operator==
                      (&pvVar4->dest_id,(GlobalBrokerId)*(BaseType *)(in_RDI + 0x14));
    if (bVar1) {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                (local_68,(long)local_c4);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::setDelayedValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff20);
    }
    else {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                (local_68,(long)local_c4);
      SmallBuffer::operator=
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(uVar6,iVar2));
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                (local_68,(long)local_c4);
      routeMessage(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    local_c4 = local_c4 + 1;
  }
  pvVar4 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                     ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                      in_stack_fffffffffffffed0);
  id.gid = *(BaseType *)(in_RDI + 0x14);
  bVar1 = GlobalFederateId::operator==(&pvVar4->dest_id,id);
  if (!bVar1) {
    pvVar4 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                       ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                        in_stack_fffffffffffffed0);
    in_stack_ffffffffffffff30 = 0xfffc6902;
    bVar1 = GlobalFederateId::operator==(&pvVar4->dest_id,(GlobalFederateId)0xfffc6902);
    if (!bVar1) {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 in_stack_fffffffffffffed0);
      SmallBuffer::operator=
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(uVar6,iVar2));
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 in_stack_fffffffffffffed0);
      routeMessage(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      goto LAB_00486c59;
    }
  }
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
             in_stack_fffffffffffffed0);
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDelayedValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(id.gid,in_stack_ffffffffffffff30),(int)((ulong)in_RDI >> 0x20),
                  in_stack_ffffffffffffff20);
LAB_00486c59:
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x486c66);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                *)(in_RDI + 0xad0),(ulong)*(ushort *)(in_RSI + 0x18));
  p_Var5 = std::
           get<2ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                     ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       *)0x486c8d);
  if (*p_Var5 == DISABLED) {
    fileops::JsonMapBuilder::reset(in_stack_fffffffffffffed0);
  }
  else {
    in_stack_fffffffffffffed0 = local_60;
    iVar2 = generateMapObjectCounter(in_stack_ffffffffffffff10);
    fileops::JsonMapBuilder::setCounterCode(in_stack_fffffffffffffed0,iVar2);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed0);
  return;
}

Assistant:

void CommonCore::processQueryResponse(const ActionMessage& message)
{
    if (message.counter == GENERAL_QUERY) {
        activeQueries.setDelayedValue(message.messageID, std::string(message.payload.to_string()));
        return;
    }
    if (isValidIndex(message.counter, mapBuilders)) {
        auto& builder = std::get<0>(mapBuilders[message.counter]);
        auto& requesters = std::get<1>(mapBuilders[message.counter]);
        if (builder.addComponent(std::string(message.payload.to_string()), message.messageID)) {
            auto str = builder.generate();
            if (message.counter == GLOBAL_FLUSH) {
                str = "{\"status\":true}";
            }
            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local ||
                requesters.back().dest_id == gDirectCoreId) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(mapBuilders[message.counter]) == QueryReuse::DISABLED) {
                builder.reset();
            } else {
                builder.setCounterCode(generateMapObjectCounter());
            }
        }
    }
}